

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O0

buffer_type * rest_rpc::rpc_service::msgpack_codec::pack_args<person>(person *args)

{
  person *in_RDI;
  buffer_type *buffer;
  person *s;
  size_t in_stack_ffffffffffffffc8;
  sbuffer *in_stack_ffffffffffffffd0;
  
  s = in_RDI;
  msgpack::v1::sbuffer::sbuffer(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::forward_as_tuple<person>(in_RDI);
  msgpack::v1::pack<msgpack::v1::sbuffer,std::tuple<person&&>>
            ((sbuffer *)s,(tuple<person_&&> *)in_RDI);
  return (buffer_type *)in_RDI;
}

Assistant:

static buffer_type pack_args(Args &&...args) {
    buffer_type buffer(init_size);
    msgpack::pack(buffer, std::forward_as_tuple(std::forward<Args>(args)...));
    return buffer;
  }